

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.cc
# Opt level: O1

int X509_PUBKEY_get0_param
              (ASN1_OBJECT **ppkalg,uchar **pk,int *ppklen,X509_ALGOR **pa,X509_PUBKEY *pub)

{
  if (ppkalg != (ASN1_OBJECT **)0x0) {
    *ppkalg = pub->algor->algorithm;
  }
  if (pk != (uchar **)0x0) {
    *pk = pub->public_key->data;
    *ppklen = pub->public_key->length;
  }
  if (pa != (X509_ALGOR **)0x0) {
    *pa = pub->algor;
  }
  return 1;
}

Assistant:

int X509_PUBKEY_get0_param(ASN1_OBJECT **out_obj, const uint8_t **out_key,
                           int *out_key_len, X509_ALGOR **out_alg,
                           X509_PUBKEY *pub) {
  if (out_obj != NULL) {
    *out_obj = pub->algor->algorithm;
  }
  if (out_key != NULL) {
    *out_key = pub->public_key->data;
    *out_key_len = pub->public_key->length;
  }
  if (out_alg != NULL) {
    *out_alg = pub->algor;
  }
  return 1;
}